

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_crypto_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  quicly_stream_t *pqVar1;
  int ret;
  quicly_stream_t *stream;
  quicly_stream_frame_t frame;
  uint in_stack_ffffffffffffffb0;
  quicly_conn_t *in_stack_ffffffffffffffb8;
  quicly_stream_frame_t *in_stack_ffffffffffffffc8;
  quicly_stream_frame_t *in_stack_ffffffffffffffd0;
  quicly_stream_t *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = quicly_decode_crypto_frame
                      ((uint8_t **)in_stack_ffffffffffffffd8,(uint8_t *)in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    pqVar1 = quicly_get_stream(in_stack_ffffffffffffffb8,(ulong)in_stack_ffffffffffffffb0);
    if (pqVar1 == (quicly_stream_t *)0x0) {
      __assert_fail("stream != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x124e,
                    "int handle_crypto_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                   );
    }
    local_4 = apply_stream_frame(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  return local_4;
}

Assistant:

static int handle_crypto_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_stream_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_crypto_frame(&state->src, state->end, &frame)) != 0)
        return ret;
    stream = quicly_get_stream(conn, -(quicly_stream_id_t)(1 + state->epoch));
    assert(stream != NULL);
    return apply_stream_frame(stream, &frame);
}